

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-test.h
# Opt level: O0

Struct * __thiscall
TypeTest::makeStruct
          (Struct *__return_storage_ptr__,TypeTest *this,TypeBuilder *builder,
          initializer_list<unsigned_long> indices)

{
  pointer pFVar1;
  const_iterator puVar2;
  Mutability local_98 [4];
  Entry local_88;
  uintptr_t local_78;
  Type local_70;
  Type ref;
  unsigned_long index;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<unsigned_long> *__range1;
  FieldList fields;
  TypeBuilder *builder_local;
  TypeTest *this_local;
  initializer_list<unsigned_long> indices_local;
  
  indices_local._M_array = (iterator)indices._M_len;
  this_local = (TypeTest *)indices._M_array;
  fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)builder;
  indices_local._M_len = (size_type)__return_storage_ptr__;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&__range1);
  __end1 = std::initializer_list<unsigned_long>::begin
                     ((initializer_list<unsigned_long> *)&this_local);
  puVar2 = std::initializer_list<unsigned_long>::end((initializer_list<unsigned_long> *)&this_local)
  ;
  for (; pFVar1 = fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage, __end1 != puVar2; __end1 = __end1 + 1)
  {
    ref.id = *__end1;
    local_88 = ::wasm::TypeBuilder::operator[]
                         ((TypeBuilder *)
                          fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,ref.id);
    local_78 = (uintptr_t)::wasm::TypeBuilder::Entry::operator_cast_to_HeapType(&local_88);
    local_70.id = ::wasm::TypeBuilder::getTempRefType((HeapType)pFVar1,(Nullability)local_78,Exact);
    local_98[0] = Mutable;
    std::vector<wasm::Field,std::allocator<wasm::Field>>::emplace_back<wasm::Type&,wasm::Mutability>
              ((vector<wasm::Field,std::allocator<wasm::Field>> *)&__range1,&local_70,local_98);
  }
  ::wasm::Struct::Struct(__return_storage_ptr__,(FieldList *)&__range1);
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

wasm::Struct makeStruct(wasm::TypeBuilder& builder,
                          std::initializer_list<size_t> indices) {
    using namespace wasm;
    FieldList fields;
    for (auto index : indices) {
      Type ref = builder.getTempRefType(builder[index], Nullable);
      fields.emplace_back(ref, Mutable);
    }
    return Struct(std::move(fields));
  }